

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int la_strntouint16_t(char *txt,int charcnt)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  ulong __maxlen;
  
  iVar3 = -1;
  if (0xfffffff6 < charcnt - 10U && txt != (char *)0x0) {
    __maxlen = (ulong)(uint)charcnt;
    sVar2 = strnlen(txt,__maxlen);
    if ((__maxlen <= sVar2) && (iVar3 = 0, 0 < charcnt)) {
      iVar1 = 1;
      do {
        if ((byte)(txt[__maxlen - 1] - 0x3aU) < 0xf6) {
          return -2;
        }
        iVar3 = iVar3 + (uint)(byte)(txt[__maxlen - 1] - 0x30) * iVar1;
        iVar1 = iVar1 * 10;
        __maxlen = __maxlen - 1;
      } while (__maxlen != 0);
    }
  }
  return iVar3;
}

Assistant:

int la_strntouint16_t(char const *txt, int charcnt) {
	if(txt == NULL ||
			charcnt < 1 ||
			charcnt > 9 ||      // prevent overflowing int
			strnlen(txt, charcnt) < (size_t)charcnt)
	{
		return -1;
	}
	int ret = 0;
	int base = 1;
	int j;
	for(int i = 0; i < charcnt; i++) {
		j = charcnt - 1 - i;
		if(txt[j] < '0' || txt[j] > '9') {
			return -2;
		}
		ret += (txt[j] - '0') * base;
		base *= 10;
	}
	return ret;
}